

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_array.cpp
# Opt level: O2

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseArray(Parser *this)

{
  Token *pTVar1;
  Token *pTVar2;
  __uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true> _Var3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  _List_node_base *p_Var7;
  bool bVar8;
  Parser *in_RSI;
  Token *pTVar9;
  initializer_list<pfederc::Position> __l;
  initializer_list<pfederc::Position> __l_00;
  initializer_list<pfederc::Position> __l_01;
  undefined1 local_e8 [14];
  undefined2 local_da;
  undefined1 local_d8 [8];
  Token *local_d0;
  undefined1 local_c8 [8];
  undefined1 local_c0 [16];
  _Base_ptr local_b0;
  list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  exprs;
  Position pos;
  undefined1 local_68 [24];
  _Head_base<0UL,_pfederc::Expr_*,_false> local_50;
  undefined1 local_48 [16];
  
  pTVar9 = in_RSI->lexer->currentToken;
  sanityExpect(in_RSI,TOK_OP_ARR_BRACKET_OPEN);
  parseExpression((Parser *)local_e8,(Precedence)in_RSI);
  if ((_Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)local_e8._0_8_ ==
      (Expr *)0x0) {
    this->lexer = (Lexer *)0x0;
  }
  else {
    bVar8 = expect(in_RSI,TOK_STMT);
    if (bVar8) {
      parseExpression((Parser *)local_68,(Precedence)in_RSI);
      if ((Lexer *)local_68._0_8_ == (Lexer *)0x0) {
        this->lexer = (Lexer *)0x0;
      }
      else {
        pTVar1 = in_RSI->lexer->currentToken;
        bVar8 = expect(in_RSI,TOK_ARR_BRACKET_CLOSE);
        if (!bVar8) {
          local_d8._0_2_ = 2;
          local_c8._0_4_ = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
          pTVar2 = in_RSI->lexer->currentToken;
          exprs.
          super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)(pTVar9->pos).line;
          exprs.
          super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_prev =
               (_List_node_base *)(pTVar9->pos).startIndex;
          exprs.
          super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ._M_impl._M_node._M_size = (pTVar9->pos).endIndex;
          __l._M_len = 1;
          __l._M_array = (iterator)&exprs;
          local_d0 = pTVar9;
          std::vector<pfederc::Position,_std::allocator<pfederc::Position>_>::vector
                    ((vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)&pos,__l,
                     (allocator_type *)&local_da);
          std::
          make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&,std::vector<pfederc::Position,std::allocator<pfederc::Position>>>
                    ((Level *)local_c0,(SyntaxErrorCode *)local_d8,(Position *)local_c8,
                     (vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)&pTVar2->pos);
          generateError((Parser *)&stack0xffffffffffffffc8,
                        (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)in_RSI);
          std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                    ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                     &stack0xffffffffffffffc8);
          std::
          unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
          ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)local_c0);
          std::_Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>::~_Vector_base
                    ((_Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_> *)&pos);
          pTVar9 = local_d0;
        }
        Position::operator+(&pTVar9->pos,(Position *)(local_e8._0_8_ + 0x20));
        Position::operator+((Position *)local_c0,
                            (Position *)&((string *)(local_68._0_8_ + 0x18))->_M_string_length);
        Position::operator+((Position *)&exprs,&pTVar1->pos);
        std::
        make_unique<pfederc::ArrayCpyExpr,pfederc::Lexer&,pfederc::Position_const&,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
                  ((Lexer *)&exprs,(Position *)in_RSI->lexer,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&pos,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_e8);
        p_Var7 = exprs.
                 super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
        exprs.
        super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
        ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
        this->lexer = (Lexer *)p_Var7;
        std::unique_ptr<pfederc::ArrayCpyExpr,_std::default_delete<pfederc::ArrayCpyExpr>_>::
        ~unique_ptr((unique_ptr<pfederc::ArrayCpyExpr,_std::default_delete<pfederc::ArrayCpyExpr>_>
                     *)&exprs);
        if ((Lexer *)local_68._0_8_ != (Lexer *)0x0) {
          (*(*(_func_int ***)local_68._0_8_)[1])();
        }
      }
    }
    else {
      bVar8 = isBiOpExpr((Expr *)local_e8._0_8_,TOK_OP_COMMA);
      if (bVar8) {
        pos.line = *(size_type *)(local_e8._0_8_ + 0x20);
        pos.startIndex =
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_e8._0_8_ + 0x28))->_M_allocated_capacity;
        pos.endIndex = *(size_t *)(local_e8._0_8_ + 0x30);
        exprs.
        super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
        ._M_impl._M_node._M_size = 0;
        _Var3.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
             (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
             (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)local_e8._0_8_;
        local_d0 = pTVar9;
        exprs.
        super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
        ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&exprs;
        exprs.
        super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
        ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&exprs;
        local_50._M_head_impl = (Expr *)this;
        while( true ) {
          local_e8._0_8_ =
               _Var3.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
               super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
               super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
          bVar8 = isBiOpExpr((Expr *)local_e8._0_8_,TOK_OP_COMMA);
          uVar5 = local_e8._0_8_;
          if (!bVar8) break;
          if (*(undefined ***)local_e8._0_8_ != &PTR__BiOpExpr_00128998) {
            __cxa_bad_cast();
          }
          local_c0._0_8_ = *(undefined8 *)(local_e8._0_8_ + 0x50);
          *(long *)(local_e8._0_8_ + 0x50) = 0;
          std::__cxx11::
          list<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
          ::emplace<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
                    ((list<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
                      *)&exprs,
                     (const_iterator)
                     exprs.
                     super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                     ._M_impl._M_node.super__List_node_base._M_next,
                     (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_c0);
          if ((Error<pfederc::SyntaxErrorCode> *)local_c0._0_8_ !=
              (Error<pfederc::SyntaxErrorCode> *)0x0) {
            (**(code **)(*(_func_int **)local_c0._0_8_ + 8))();
          }
          uVar6 = local_e8._0_8_;
          _Var3.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
          super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
          super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
               *(__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                (uVar5 + 0x48);
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(uVar5 + 0x48))->_M_allocated_capacity = 0;
          if ((Expr *)local_e8._0_8_ != (Expr *)0x0) {
            lVar4 = *(long *)local_e8._0_8_;
            local_e8._0_8_ =
                 _Var3.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                 _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                 super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
            (**(code **)(lVar4 + 8))(uVar6);
            _Var3.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
                 (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
                 (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)local_e8._0_8_
            ;
          }
        }
        std::__cxx11::
        list<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
        ::emplace<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
                  ((list<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
                    *)&exprs,
                   (const_iterator)
                   exprs.
                   super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_e8);
        this = (Parser *)local_50._M_head_impl;
        pTVar9 = in_RSI->lexer->currentToken;
        bVar8 = expect(in_RSI,TOK_ARR_BRACKET_CLOSE);
        if (!bVar8) {
          local_da = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
          local_d8._0_4_ = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
          pTVar1 = in_RSI->lexer->currentToken;
          local_68._0_8_ = (local_d0->pos).line;
          local_68._8_8_ = (local_d0->pos).startIndex;
          local_68._16_8_ = (local_d0->pos).endIndex;
          __l_01._M_len = 1;
          __l_01._M_array = (iterator)local_68;
          std::vector<pfederc::Position,_std::allocator<pfederc::Position>_>::vector
                    ((vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)local_c0,
                     __l_01,(allocator_type *)(local_d8 + 7));
          std::
          make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&,std::vector<pfederc::Position,std::allocator<pfederc::Position>>>
                    ((Level *)local_c8,(SyntaxErrorCode *)&local_da,(Position *)local_d8,
                     (vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)&pTVar1->pos);
          generateError((Parser *)(local_48 + 8),
                        (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)in_RSI);
          std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                    ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                     (local_48 + 8));
          std::
          unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
          ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)local_c8);
          std::_Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>::~_Vector_base
                    ((_Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_> *)local_c0
                    );
        }
        Position::operator+(&pos,&local_d0->pos);
        Position::operator+((Position *)local_68,&pTVar9->pos);
        pos.endIndex = (size_t)local_b0;
        pos.line = local_c0._0_8_;
        pos.startIndex = local_c0._8_8_;
        std::
        make_unique<pfederc::ArrayLitExpr,pfederc::Lexer&,pfederc::Position&,std::__cxx11::list<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
                  ((Lexer *)local_c0,(Position *)in_RSI->lexer,
                   (list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                    *)&pos);
        uVar5 = local_c0._0_8_;
        local_c0._0_8_ =
             (__uniq_ptr_impl<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
              )0x0;
        ((Expr *)this)->_vptr_Expr = (_func_int **)uVar5;
        std::unique_ptr<pfederc::ArrayLitExpr,_std::default_delete<pfederc::ArrayLitExpr>_>::
        ~unique_ptr((unique_ptr<pfederc::ArrayLitExpr,_std::default_delete<pfederc::ArrayLitExpr>_>
                     *)local_c0);
        std::__cxx11::
        _List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
        ::_M_clear(&exprs.
                    super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                  );
      }
      else {
        pTVar1 = in_RSI->lexer->currentToken;
        bVar8 = expect(in_RSI,TOK_ARR_BRACKET_CLOSE);
        if (!bVar8) {
          local_c8._0_2_ = 2;
          local_68._0_4_ = 2;
          pTVar2 = in_RSI->lexer->currentToken;
          exprs.
          super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)(pTVar9->pos).line;
          exprs.
          super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_prev =
               (_List_node_base *)(pTVar9->pos).startIndex;
          exprs.
          super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ._M_impl._M_node._M_size = (pTVar9->pos).endIndex;
          __l_00._M_len = 1;
          __l_00._M_array = (iterator)&exprs;
          local_d0 = pTVar9;
          std::vector<pfederc::Position,_std::allocator<pfederc::Position>_>::vector
                    ((vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)&pos,__l_00,
                     (allocator_type *)local_d8);
          std::
          make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&,std::vector<pfederc::Position,std::allocator<pfederc::Position>>>
                    ((Level *)local_c0,(SyntaxErrorCode *)local_c8,(Position *)local_68,
                     (vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)&pTVar2->pos);
          generateError((Parser *)local_48,
                        (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)in_RSI);
          std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                    ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                     local_48);
          std::
          unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
          ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)local_c0);
          std::_Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>::~_Vector_base
                    ((_Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_> *)&pos);
          pTVar9 = local_d0;
        }
        Position::operator+(&pTVar9->pos,(Position *)(local_e8._0_8_ + 0x20));
        Position::operator+((Position *)&exprs,&pTVar1->pos);
        std::
        make_unique<pfederc::ArrayEmptyExpr,pfederc::Lexer&,pfederc::Position_const&,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
                  ((Lexer *)&exprs,(Position *)in_RSI->lexer,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&pos);
        p_Var7 = exprs.
                 super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
        exprs.
        super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
        ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
        this->lexer = (Lexer *)p_Var7;
        std::unique_ptr<pfederc::ArrayEmptyExpr,_std::default_delete<pfederc::ArrayEmptyExpr>_>::
        ~unique_ptr((unique_ptr<pfederc::ArrayEmptyExpr,_std::default_delete<pfederc::ArrayEmptyExpr>_>
                     *)&exprs);
      }
    }
    if ((_Head_base<0UL,_pfederc::Expr_*,_false>)local_e8._0_8_ !=
        (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0) {
      (*(*(_func_int ***)local_e8._0_8_)[1])();
    }
  }
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseArray() noexcept {
  const Token *const startToken = lexer.getCurrentToken();
  sanityExpect(TokenType::TOK_OP_ARR_BRACKET_OPEN);

  std::unique_ptr<Expr> expr0(parseExpression());
  if (!expr0)
    return nullptr;

  if (expect(TokenType::TOK_STMT)) {
    std::unique_ptr<Expr> expr1(parseExpression());
    if (!expr1)
      return nullptr;

    const Token *const endToken = lexer.getCurrentToken();
    if (!expect(TokenType::TOK_ARR_BRACKET_CLOSE)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_ARR_CLOSING_BRACKET,
        lexer.getCurrentToken()->getPosition(),
        std::vector<Position> { startToken->getPosition() }));
    }

    const Position pos(startToken->getPosition() +
      expr0->getPosition() + expr1->getPosition() + endToken->getPosition());

    return std::make_unique<ArrayCpyExpr>(lexer, pos,
      std::move(expr0), std::move(expr1));
  }
  // now it's either an ArrayEmptyExpr or ArrayLitExpr
  if (isBiOpExpr(*expr0, TokenType::TOK_OP_COMMA)) {
    Position pos(expr0->getPosition());

    std::list<std::unique_ptr<Expr>> exprs;
    while (isBiOpExpr(*expr0, TokenType::TOK_OP_COMMA)) {
      BiOpExpr &biopexpr = dynamic_cast<BiOpExpr&>(*expr0);
      exprs.insert(exprs.begin(), biopexpr.getRightPtr());
      expr0 = biopexpr.getLeftPtr();
    }

    exprs.insert(exprs.begin(), std::move(expr0));

    const Token *const endToken = lexer.getCurrentToken();
    if (!expect(TokenType::TOK_ARR_BRACKET_CLOSE)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_ARR_CLOSING_BRACKET,
        lexer.getCurrentToken()->getPosition(),
        std::vector<Position> { startToken->getPosition() }));
    }

    pos = pos + startToken->getPosition() + endToken->getPosition();

    return std::make_unique<ArrayLitExpr>(lexer, pos, std::move(exprs));
  }

  const Token *const endToken = lexer.getCurrentToken();
  if (!expect(TokenType::TOK_ARR_BRACKET_CLOSE)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_ARR_CLOSING_BRACKET,
      lexer.getCurrentToken()->getPosition(),
      std::vector<Position> { startToken->getPosition() }));
  }

  const Position pos(startToken->getPosition() +
    expr0->getPosition() + endToken->getPosition());

  return std::make_unique<ArrayEmptyExpr>(lexer, pos,
    std::move(expr0));
}